

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

bool __thiscall ON_Buffer::Seek(ON_Buffer *this,ON__INT64 offset,int origin)

{
  ulong local_38;
  ON__UINT64 pos1;
  ON__UINT64 pos0;
  int origin_local;
  ON__INT64 offset_local;
  ON_Buffer *this_local;
  
  if (origin == 0) {
    pos1 = 0;
  }
  else if (origin == 1) {
    pos1 = this->m_current_position;
  }
  else {
    if (origin != 2) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x20a,"","Invalid origin parameter");
      return false;
    }
    pos1 = this->m_buffer_size;
  }
  if (offset < 0) {
    if (pos1 < (ulong)-offset) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x215,"","Attempt to seek before start of buffer.");
      return false;
    }
    local_38 = pos1 + offset;
  }
  else if (offset < 1) {
    local_38 = pos1;
  }
  else {
    local_38 = pos1 + offset;
    if (local_38 <= pos1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x221,"",
                 "Attempt to seek to a position that is too large for 64-bit unsigned int storage.")
      ;
      return false;
    }
  }
  if (local_38 != this->m_current_position) {
    this->m_current_position = local_38;
    this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
  }
  return true;
}

Assistant:

bool ON_Buffer::Seek( ON__INT64 offset, int origin )
{
  ON__UINT64 pos0, pos1;

  switch(origin)
  {
  case 0: // Seek from beginning of start.
    pos0 = 0;
    break;

  case 1: // Seek from current position.
    pos0 = m_current_position;
    break;

  case 2: // Seek from end.
    pos0 = m_buffer_size;
    break;

  default:
    {
      ON_ERROR("Invalid origin parameter");
      return false;
    }
    break;
  }

  if ( offset < 0 )
  {
    if ( pos0 < (ON__UINT64)(-offset) )
    {
      // current position cannot be negative
      ON_ERROR("Attempt to seek before start of buffer.");
      return false; 
    }    
    pos1 = pos0 - (ON__UINT64)(-offset); // overflow cannot happen in this operation
  }
  else if ( offset > 0 )
  {
    // current position can be >= m_buffer_size
    pos1 = pos0 + (ON__UINT64)(offset); // overflow is possible in this operation
    if ( pos1 <= pos0 )
    {
      // overflow
      ON_ERROR("Attempt to seek to a position that is too large for 64-bit unsigned int storage.");
      return false; 
    }
  }
  else
  {
    pos1 = pos0;
  }

  if ( pos1 != m_current_position )
  {
    m_current_position = pos1;
    m_current_segment = 0;
  }

  return true;
}